

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

void dgn_growths(level *lev,boolean showmsg,boolean update)

{
  undefined1 *puVar1;
  byte *pbVar2;
  monst *pmVar3;
  xchar xVar4;
  level *lev_00;
  boolean bVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  trap *ptVar11;
  obj *poVar12;
  char *pcVar13;
  byte bVar14;
  int iVar15;
  char *pcVar16;
  undefined7 in_register_00000011;
  ulong uVar17;
  char *pcVar18;
  rm (*parVar19) [21];
  schar *psVar20;
  int iVar21;
  undefined7 in_register_00000031;
  ulong uVar22;
  int iVar23;
  long lVar24;
  xchar xVar25;
  long lVar26;
  obj *in_stack_ffffffffffffff88;
  coord pos;
  xchar local_6b;
  coord local_6a;
  level *local_68;
  undefined4 local_5c;
  undefined4 local_58;
  xchar local_51;
  long local_50;
  rm (*local_48) [21];
  long local_40;
  rm (*local_38) [21];
  
  local_58 = (undefined4)CONCAT71(in_register_00000011,update);
  local_5c = (undefined4)CONCAT71(in_register_00000031,showmsg);
  uVar8 = mt_random();
  local_6b = -1;
  local_51 = -1;
  rndmappos(&local_6b,&local_51);
  xVar4 = local_51;
  xVar25 = local_6b;
  local_48 = lev->locations;
  cVar6 = lev->locations[local_6b][local_51].typ;
  local_68 = lev;
  if (((cVar6 == '\r') || ((cVar6 == '\0' && ((*(uint *)&(lev->flags).field_0x8 & 0x100000) != 0))))
     && (bVar5 = may_dig(lev,local_6b,local_51), bVar5 != '\0')) {
    uVar9 = mt_random();
    dtoxy(&pos,uVar9 & 7);
    pos.x = pos.x + xVar25;
    pos.y = pos.y + xVar4;
    uVar10 = mt_random();
    if (uVar10 % 3 == 0) {
      uVar10 = mt_random();
      dtoxy(&local_6a,uVar9 + (uVar10 & 1) & 7);
      pos.x = pos.x + local_6a.x;
      pos.y = pos.y + local_6a.y;
    }
    parVar19 = local_48;
    if (((byte)(pos.x - 1U) < 0x4f) && ((byte)pos.y < 0x15)) {
      uVar17 = (ulong)(byte)pos.x;
      uVar22 = (ulong)(byte)pos.y;
      if (((((local_48[uVar17][uVar22].field_0x7 & 4) != 0) &&
           (((((viz_array[uVar22][uVar17] & 2U) == 0 &&
              (cVar6 = inside_shop(local_68,pos.x,pos.y), cVar6 == '\0')) &&
             ((parVar19[uVar17][uVar22].typ & 0xfeU) == 0x18)) &&
            ((u.ux != pos.x || (u.uy != pos.y)))))) &&
          ((pmVar3 = local_68->monsters[pos.x][pos.y], pmVar3 == (monst *)0x0 ||
           ((pmVar3->field_0x61 & 2) != 0)))) &&
         ((ptVar11 = t_at(local_68,(int)pos.x,(int)pos.y), ptVar11 == (trap *)0x0 &&
          (level->objects[pos.x][pos.y] == (obj *)0x0)))) {
        iVar15 = 0;
        for (uVar9 = (int)pos.x - 1; uVar9 != (int)pos.x + 2U; uVar9 = uVar9 + 1) {
          for (iVar23 = -1; iVar23 != 2; iVar23 = iVar23 + 1) {
            if (((0x4e < uVar9 - 1) || (0x14 < (uint)(pos.y + iVar23))) ||
               (local_48[uVar9][(uint)(pos.y + iVar23)].typ < '\x18')) {
              iVar15 = iVar15 + 1;
            }
          }
        }
        if (iVar15 < 3) {
          parVar19[uVar17][uVar22].typ = '\r';
          puVar1 = &parVar19[uVar17][uVar22].field_0x6;
          *puVar1 = *puVar1 & 0xef;
          block_point((int)pos.x,(int)pos.y);
        }
      }
    }
  }
  iVar15 = herb_info[uVar8 & 3].herb;
  if (herb_info[uVar8 & 3].in_water == '\0') {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar4 = local_6a.x;
    xVar25 = local_6b;
    poVar12 = sobj_at(iVar15,local_68,(int)local_6a.x,(int)local_6b);
    if ((poVar12 == (obj *)0x0) ||
       (bVar5 = herb_can_grow_at(local_68,xVar4,xVar25,'\0'), bVar5 == '\0')) goto LAB_0019bb1a;
    iVar23 = poVar12->quan;
    uVar8 = mt_random();
    iVar21 = 0;
    if ((int)(uVar8 % 3) < iVar23) {
      uVar8 = mt_random();
      local_50 = CONCAT71(local_50._1_7_,xVar25);
      for (; iVar21 != 8; iVar21 = iVar21 + 1) {
        dtoxy(&pos,uVar8 + iVar21 & 7);
        pos.x = pos.x + xVar4;
        pos.y = pos.y + xVar25;
        if (((byte)pos.y < 0x15 && (byte)(pos.x - 1U) < 0x4f) &&
           (bVar5 = herb_can_grow_at(local_68,pos.x,pos.y,'\0'), bVar5 != '\0')) {
          poVar12 = sobj_at(iVar15,local_68,(int)pos.x,(int)pos.y);
          lev_00 = local_68;
          if (poVar12 == (obj *)0x0) {
            poVar12 = mksobj(local_68,iVar15,'\x01','\0');
            poVar12->quan = 1;
            uVar8 = weight(poVar12);
            poVar12->owt = uVar8;
            place_object(poVar12,lev_00,(int)pos.x,(int)pos.y);
            if ((char)local_58 != '\0') {
              newsym((int)pos.x,(int)pos.y);
            }
            if ((((viz_array[pos.y][pos.x] & 2U) != 0) && ((char)local_5c != '\0')) &&
               (flags.verbose != '\0')) {
              if (iVar15 == 0x11d) {
                pcVar13 = "some garlic";
              }
              else {
                pcVar13 = xname(poVar12);
                pcVar13 = an(pcVar13);
              }
              pcVar18 = surface((int)pos.x,(int)pos.y);
              Norep("Suddenly you notice %s growing on the %s.",pcVar13,pcVar18);
            }
            break;
          }
          iVar23 = poVar12->quan;
          uVar9 = mt_random();
          xVar25 = (char)local_50;
          if (iVar23 <= (int)(uVar9 % 3)) goto LAB_0019bb0c;
        }
      }
      goto LAB_0019bb1a;
    }
  }
  else {
    pos.x = -1;
    local_6a.x = -1;
    rndmappos(&pos.x,&local_6a.x);
    xVar4 = local_6a.x;
    xVar25 = pos.x;
    poVar12 = sobj_at(iVar15,local_68,(int)pos.x,(int)local_6a.x);
    if ((poVar12 == (obj *)0x0) ||
       (bVar5 = herb_can_grow_at(local_68,xVar25,xVar4,'\x01'), bVar5 == '\0')) goto LAB_0019bb1a;
  }
LAB_0019bb0c:
  poVar12->quan = poVar12->quan + 1;
  uVar8 = weight(poVar12);
  poVar12->owt = uVar8;
LAB_0019bb1a:
  uVar8 = mt_random();
  if (uVar8 % 0x1e == 0) {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar25 = local_6b;
    local_50 = (long)local_6a.x;
    lVar24 = (long)local_6b;
    parVar19 = local_48 + local_50;
    cVar6 = (*parVar19)[lVar24].typ;
    if (((cVar6 == '\r') ||
        ((cVar6 == '\0' && ((*(uint *)&(local_68->flags).field_0x8 & 0x100000) != 0)))) &&
       ((((*parVar19)[lVar24].field_0x6 & 0x10) == 0 &&
        (bVar5 = may_dig(local_68,local_6a.x,local_6b), bVar5 != '\0')))) {
      local_40 = lVar24 * 0xc;
      local_38 = parVar19;
      uVar8 = mt_random();
      for (iVar15 = 0; iVar15 != 8; iVar15 = iVar15 + 1) {
        dtoxy(&pos,uVar8 + iVar15 & 7);
        parVar19 = local_48;
        bVar7 = pos.x + (char)local_50;
        bVar14 = pos.y + xVar25;
        pos.x = bVar7;
        pos.y = bVar14;
        if ((0x4e < (byte)(bVar7 - 1)) || (0x14 < bVar14)) break;
        cVar6 = local_48[bVar7][bVar14].typ;
        if (('\x17' < cVar6 || (byte)(cVar6 - 0x11U) < 4) &&
           (poVar12 = rnd_treefruit_at((uint)bVar7,(uint)bVar14), poVar12 != (obj *)0x0)) {
          poVar12->quan = 1;
          uVar8 = weight(poVar12);
          poVar12->owt = uVar8;
          obj_extract_self(poVar12);
          if ((char)local_5c != '\0') {
            psVar20 = &parVar19[bVar7][bVar14].typ;
            if ((viz_array[pos.y][pos.x] & 2U) == 0) {
              if ((viz_array[lVar24][local_50] & 2U) == 0) {
                iVar15 = dist2((int)pos.x,(int)pos.y,(int)u.ux,(int)u.uy);
                if ((iVar15 < 9) && (poVar12->otyp != 0x115)) {
                  cVar6 = *psVar20;
                  pcVar13 = "splut";
                  if ((byte)(cVar6 - 0x11U) < 4) {
                    pcVar13 = "plop";
                  }
                  if (cVar6 == '\x1c') {
                    pcVar13 = "plop";
                  }
                  You_hear("a %s!",pcVar13);
                }
                goto LAB_0019bfee;
              }
              pcVar13 = "Something";
LAB_0019bfb6:
              bVar7 = *psVar20;
              pcVar16 = "the tree";
              if ((char)bVar7 < '\x11') {
                pcVar18 = "";
              }
              else {
                pcVar18 = "";
                if (bVar7 < 0x15) {
                  pcVar18 = " into the water";
                }
              }
            }
            else {
              pcVar13 = xname(poVar12);
              pcVar13 = An(pcVar13);
              if ((viz_array[lVar24][local_50] & 2U) != 0) goto LAB_0019bfb6;
              pcVar18 = "";
              pcVar16 = "somewhere";
            }
            Norep("%s falls from %s%s.",pcVar13,pcVar16,pcVar18);
          }
LAB_0019bfee:
          place_object(poVar12,local_68,(int)pos.x,(int)pos.y);
          stackobj(in_stack_ffffffffffffff88);
          uVar8 = mt_random();
          if (uVar8 % 6 != 0) {
            pbVar2 = &(*local_38)[0].field_0x6 + local_40;
            *pbVar2 = *pbVar2 | 0x10;
          }
          if ((char)local_58 != '\0') {
            newsym((int)pos.x,(int)pos.y);
          }
          break;
        }
      }
    }
  }
  uVar8 = mt_random();
  bVar5 = on_level(&local_68->z,&dungeon_topology.d_water_level);
  uVar9 = 200;
  if (bVar5 == '\0') {
    uVar9 = 0x19;
  }
  local_6a.x = -1;
  local_6b = -1;
  rndmappos(&local_6a.x,&local_6b);
  dtoxy(&pos,uVar8 & 7);
  xVar4 = local_6a.x;
  xVar25 = local_6b;
  lVar26 = (long)local_6a.x;
  pos.x = pos.x + local_6a.x;
  lVar24 = (long)local_6b;
  pos.y = pos.y + local_6b;
  if (((((byte)pos.y < 0x15 && (byte)(pos.x - 1U) < 0x4f) &&
       ((byte)(local_48[lVar26][lVar24].typ - 0x11U) < 4)) &&
      ((byte)(local_48[(byte)pos.x][(byte)pos.y].typ - 0x11U) < 4)) &&
     ((poVar12 = local_68->objects[lVar26][lVar24], poVar12 != (obj *)0x0 &&
      (poVar12->where == '\x01')))) {
    if (1 < poVar12->quan) {
      poVar12 = splitobj(poVar12,(ulong)(poVar12->quan - 1));
    }
    if (uVar9 < poVar12->owt) {
      stackobj(in_stack_ffffffffffffff88);
    }
    else {
      if ((((char)local_5c != '\0') && ((u._1052_1_ & 2) != 0)) &&
         (((viz_array[pos.y][pos.x] & 2U) != 0 || ((viz_array[lVar24][lVar26] & 2U) != 0)))) {
        pcVar13 = xname(poVar12);
        pcVar13 = An(pcVar13);
        if ((viz_array[lVar24][lVar26] & 2U) == 0) {
          pcVar18 = " towards you";
        }
        else {
          pcVar18 = "";
          if ((viz_array[pos.y][pos.x] & 2U) == 0) {
            pcVar18 = " away from you";
          }
        }
        pcVar16 = " the currents of";
        if (flags.verbose == '\0') {
          pcVar16 = "";
        }
        Norep("%s floats%s in%s the murky water.",pcVar13,pcVar18,pcVar16);
      }
      obj_extract_self(poVar12);
      place_object(poVar12,local_68,(int)pos.x,(int)pos.y);
      stackobj(in_stack_ffffffffffffff88);
      if ((char)local_58 != '\0') {
        newsym((int)xVar4,(int)xVar25);
        newsym((int)pos.x,(int)pos.y);
      }
    }
  }
  return;
}

Assistant:

void dgn_growths(struct level *lev, boolean showmsg, boolean update)
{
	int herbnum = rn2(SIZE(herb_info));
	seed_tree(lev, -1, -1);
	if (herb_info[herbnum].in_water)
	    grow_water_herbs(herb_info[herbnum].herb, lev, -1, -1);
	else
	    grow_herbs(herb_info[herbnum].herb, lev, -1, -1, showmsg, update);
	if (!rn2(30))
	    drop_ripe_treefruit(lev, -1, -1, showmsg, update);
	water_current(lev, -1, -1, rn2(8),
		      Is_waterlevel(&lev->z) ? 200 : 25, showmsg, update);
}